

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_bool32 drmp3__on_seek_memory(void *pUserData,int byteOffset,drmp3_seek_origin origin)

{
  drmp3 *pMP3;
  drmp3_seek_origin origin_local;
  int byteOffset_local;
  void *pUserData_local;
  
  if (origin == drmp3_seek_origin_current) {
    byteOffset_local = byteOffset;
    if (byteOffset < 1) {
      if (*(ulong *)((long)pUserData + 0x52e8) < (ulong)(long)-byteOffset) {
        byteOffset_local = -(int)*(undefined8 *)((long)pUserData + 0x52e8);
      }
    }
    else if (*(ulong *)((long)pUserData + 0x52e0) <
             (ulong)(*(long *)((long)pUserData + 0x52e8) + (long)byteOffset)) {
      byteOffset_local =
           (int)*(undefined8 *)((long)pUserData + 0x52e0) -
           (int)*(undefined8 *)((long)pUserData + 0x52e8);
    }
    *(long *)((long)pUserData + 0x52e8) =
         (long)byteOffset_local + *(long *)((long)pUserData + 0x52e8);
  }
  else if (*(ulong *)((long)pUserData + 0x52e0) < (ulong)(uint)byteOffset) {
    *(undefined8 *)((long)pUserData + 0x52e8) = *(undefined8 *)((long)pUserData + 0x52e0);
  }
  else {
    *(long *)((long)pUserData + 0x52e8) = (long)byteOffset;
  }
  return 1;
}

Assistant:

static drmp3_bool32 drmp3__on_seek_memory(void* pUserData, int byteOffset, drmp3_seek_origin origin)
{
    drmp3* pMP3 = (drmp3*)pUserData;
            drmp3_assert(pMP3 != NULL);

    if (origin == drmp3_seek_origin_current) {
        if (byteOffset > 0) {
            if (pMP3->memory.currentReadPos + byteOffset > pMP3->memory.dataSize) {
                byteOffset = (int)(pMP3->memory.dataSize - pMP3->memory.currentReadPos);  // Trying to seek too far forward.
            }
        } else {
            if (pMP3->memory.currentReadPos < (size_t)-byteOffset) {
                byteOffset = -(int)pMP3->memory.currentReadPos;  // Trying to seek too far backwards.
            }
        }

        // This will never underflow thanks to the clamps above.
        pMP3->memory.currentReadPos += byteOffset;
    } else {
        if ((drmp3_uint32)byteOffset <= pMP3->memory.dataSize) {
            pMP3->memory.currentReadPos = byteOffset;
        } else {
            pMP3->memory.currentReadPos = pMP3->memory.dataSize;  // Trying to seek too far forward.
        }
    }

    return DRMP3_TRUE;
}